

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O1

int GetLatestDataMES(MES *pMES,double *pDistance)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  __time_t _Var6;
  long *plVar7;
  char cVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  CHRONO chrono;
  char recvbuf [48];
  char savebuf [24];
  timespec local_d8;
  timespec local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  long lStack_a0;
  timespec local_98;
  int local_88;
  double *local_80;
  char local_78 [48];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  iVar3 = clock_getres(4,&local_98);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_c8), iVar3 == 0)) {
    local_88 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    lStack_a0 = 0;
  }
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  iVar3 = (pMES->RS232Port).DevType;
  cVar8 = '\x01';
  if (iVar3 - 1U < 4) {
    uVar4 = recv((pMES->RS232Port).s,local_78,0x17,0);
    if (-1 < (int)uVar4) {
      cVar8 = ((int)uVar4 == 0) * '\x02';
    }
  }
  else {
    uVar4 = 0;
    if (iVar3 == 0) {
      uVar4 = read(*(int *)&(pMES->RS232Port).hDev,local_78,0x17);
      cVar8 = '\x01';
      if (-1 < (int)uVar4) {
        cVar8 = ((int)uVar4 == 0) * '\x02';
      }
    }
  }
  if (cVar8 == '\0') {
    iVar3 = (int)uVar4;
    if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_78,(long)iVar3,1,(FILE *)pMES->pfSaveFile);
      fflush((FILE *)pMES->pfSaveFile);
    }
    local_80 = pDistance;
    if (iVar3 < 0x17) {
      uVar12 = uVar4 & 0xffffffff;
    }
    else {
      if (iVar3 == 0x17) {
        do {
          lVar5 = local_a8;
          plVar7 = &lStack_a0;
          if (local_88 == 0) {
            clock_gettime(4,&local_d8);
            local_d8.tv_sec =
                 (local_d8.tv_sec + local_a8 + (local_d8.tv_nsec + lStack_a0) / 1000000000) -
                 local_c8.tv_sec;
            local_d8.tv_nsec = (local_d8.tv_nsec + lStack_a0) % 1000000000 - local_c8.tv_nsec;
            if (local_d8.tv_nsec < 0) {
              local_d8.tv_sec = local_d8.tv_sec + local_d8.tv_nsec / 1000000000 + -1;
              local_d8.tv_nsec = local_d8.tv_nsec % 1000000000 + 1000000000;
            }
            lVar5 = local_d8.tv_sec;
            plVar7 = &local_d8.tv_nsec;
          }
          if (4.0 < (double)*plVar7 / 1000000000.0 + (double)lVar5) goto LAB_001c2c3c;
          memcpy(&local_48,local_78,uVar4 & 0xffffffff);
          iVar3 = (pMES->RS232Port).DevType;
          cVar8 = '\x01';
          if (iVar3 - 1U < 4) {
            uVar4 = recv((pMES->RS232Port).s,local_78,0x17,0);
            if (-1 < (int)uVar4) {
              cVar8 = ((int)uVar4 == 0) * '\x02';
            }
          }
          else if (iVar3 == 0) {
            uVar4 = read(*(int *)&(pMES->RS232Port).hDev,local_78,0x17);
            cVar8 = ((int)uVar4 == 0) * '\x02';
            if ((int)uVar4 < 0) {
              cVar8 = '\x01';
            }
          }
          if (cVar8 != '\0') goto LAB_001c26d0;
          if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
            fwrite(local_78,(long)(int)uVar4,1,(FILE *)pMES->pfSaveFile);
            fflush((FILE *)pMES->pfSaveFile);
          }
        } while ((int)uVar4 == 0x17);
      }
      sVar11 = (size_t)(int)uVar4;
      memmove(local_78 + (0x17 - sVar11),local_78,sVar11);
      uVar12 = 0x17;
      memcpy(local_78,(void *)((long)&local_48 + sVar11),(long)(0x17 - (int)uVar4));
    }
    pcVar10 = local_78;
    sVar11 = strlen(pcVar10);
    iVar3 = (int)sVar11 + 1;
    do {
      if ((((iVar3 == 0xb) && (pcVar10[7] == 'm')) && (pcVar10[8] == '\r')) && (pcVar10[9] == '\n'))
      goto LAB_001c2972;
      pcVar10 = pcVar10 + 1;
      iVar3 = iVar3 + -1;
    } while (10 < iVar3);
    pcVar10 = (char *)0x0;
LAB_001c2972:
    if (pcVar10 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      do {
        pcVar9 = pcVar10;
        sVar11 = strlen(pcVar9 + 1);
        pcVar10 = pcVar9 + 10;
        iVar3 = (int)sVar11 + 1;
        do {
          if (((iVar3 == 0xb) && (pcVar10[-2] == 'm')) &&
             ((pcVar10[-1] == '\r' && (*pcVar10 == '\n')))) {
            pcVar10 = pcVar10 + -9;
            goto LAB_001c29b3;
          }
          pcVar10 = pcVar10 + 1;
          iVar3 = iVar3 + -1;
        } while (10 < iVar3);
        pcVar10 = (char *)0x0;
LAB_001c29b3:
      } while (pcVar10 != (char *)0x0);
    }
    if (pcVar9 == (char *)0x0) {
      do {
        if (local_88 == 0) {
          clock_gettime(4,&local_d8);
          local_d8.tv_sec =
               (local_d8.tv_sec + local_a8 + (local_d8.tv_nsec + lStack_a0) / 1000000000) -
               local_c8.tv_sec;
          local_d8.tv_nsec = (local_d8.tv_nsec + lStack_a0) % 1000000000 - local_c8.tv_nsec;
          if (local_d8.tv_nsec < 0) {
            local_d8.tv_sec = local_d8.tv_sec + local_d8.tv_nsec / 1000000000 + -1;
            local_d8.tv_nsec = local_d8.tv_nsec % 1000000000 + 1000000000;
          }
          plVar7 = &local_d8.tv_nsec;
          _Var6 = local_d8.tv_sec;
        }
        else {
          plVar7 = &lStack_a0;
          _Var6 = local_a8;
        }
        if (4.0 < (double)*plVar7 / 1000000000.0 + (double)_Var6) {
LAB_001c2c3c:
          puts("Error reading data from a MES : Message timeout. ");
          return 2;
        }
        iVar3 = (int)uVar12;
        if (0x2e < iVar3) {
          puts("Error reading data from a MES : Invalid data. ");
          return 4;
        }
        pcVar10 = local_78 + iVar3;
        iVar1 = (pMES->RS232Port).DevType;
        cVar8 = '\x01';
        if (iVar1 - 1U < 4) {
          uVar4 = recv((pMES->RS232Port).s,pcVar10,(long)(int)(0x2fU - iVar3),0);
          if (-1 < (int)uVar4) {
            cVar8 = ((int)uVar4 == 0) * '\x02';
          }
        }
        else if (iVar1 == 0) {
          uVar4 = read(*(int *)&(pMES->RS232Port).hDev,pcVar10,(ulong)(0x2fU - iVar3));
          cVar8 = ((int)uVar4 == 0) * '\x02';
          if ((int)uVar4 < 0) {
            cVar8 = '\x01';
          }
        }
        if (cVar8 != '\0') goto LAB_001c26d0;
        if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
          fwrite(pcVar10,(long)(int)uVar4,1,(FILE *)pMES->pfSaveFile);
          fflush((FILE *)pMES->pfSaveFile);
        }
        uVar12 = (ulong)(uint)(iVar3 + (int)uVar4);
        sVar11 = strlen(local_78);
        iVar3 = (int)sVar11 + 1;
        pcVar10 = local_78;
        do {
          if ((((iVar3 == 0xb) && (pcVar10[7] == 'm')) && (pcVar10[8] == '\r')) &&
             (pcVar10[9] == '\n')) goto LAB_001c2bda;
          pcVar10 = pcVar10 + 1;
          iVar3 = iVar3 + -1;
        } while (10 < iVar3);
        pcVar10 = (char *)0x0;
LAB_001c2bda:
        if (pcVar10 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          do {
            pcVar9 = pcVar10;
            sVar11 = strlen(pcVar9 + 1);
            pcVar10 = pcVar9 + 10;
            iVar3 = (int)sVar11 + 1;
            do {
              if (((iVar3 == 0xb) && (pcVar10[-2] == 'm')) &&
                 ((pcVar10[-1] == '\r' && (*pcVar10 == '\n')))) {
                pcVar10 = pcVar10 + -9;
                goto LAB_001c2c1d;
              }
              pcVar10 = pcVar10 + 1;
              iVar3 = iVar3 + -1;
            } while (10 < iVar3);
            pcVar10 = (char *)0x0;
LAB_001c2c1d:
          } while (pcVar10 != (char *)0x0);
        }
      } while (pcVar9 == (char *)0x0);
    }
    pdVar2 = local_80;
    iVar3 = __isoc99_sscanf(pcVar9,"%lfm\r\n",local_80);
    if (iVar3 == 1) {
      pMES->LastDistance = *pdVar2;
      return 0;
    }
    pcVar10 = "Error reading data from a MES : Invalid data. ";
  }
  else {
LAB_001c26d0:
    pcVar10 = "Error reading data from a MES. ";
  }
  puts(pcVar10);
  return 1;
}

Assistant:

inline int GetLatestDataMES(MES* pMES, double* pDistance)
{
	char recvbuf[2*MAX_NB_BYTES_MES];
	char savebuf[MAX_NB_BYTES_MES];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MES-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MES. \n");
		return EXIT_FAILURE;
	}
	if ((pMES->bSaveRawData)&&(pMES->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
		fflush(pMES->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
			{
				printf("Error reading data from a MES : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MES. \n");
				return EXIT_FAILURE;
			}
			if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
				fflush(pMES->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr = FindLatestMESMessage(recvbuf);

	while (!ptr)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
		{
			printf("Error reading data from a MES : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MES-1)
		{
			printf("Error reading data from a MES : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MES-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MES. \n");
			return EXIT_FAILURE;
		}
		if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pMES->pfSaveFile);
			fflush(pMES->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr = FindLatestMESMessage(recvbuf);
	}

	// Analyze data.

	if (sscanf(ptr, "%lfm\r\n", pDistance) != 1)
	{
		printf("Error reading data from a MES : Invalid data. \n");
		return EXIT_FAILURE;
	}

	pMES->LastDistance = *pDistance;

	return EXIT_SUCCESS;
}